

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  float *pfVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  float *pfVar11;
  undefined1 (*pauVar12) [16];
  long lVar13;
  undefined1 in_XMM2 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  iVar2 = a->c;
  if (0 < (long)iVar2) {
    uVar6 = a->h * a->w * a->d * a->elempack;
    lVar10 = 0;
    do {
      pfVar11 = (float *)(a->cstep * lVar10 * a->elemsize + (long)a->data);
      pauVar12 = (undefined1 (*) [16])(b->cstep * lVar10 * b->elemsize + (long)b->data);
      pfVar7 = (float *)(c->cstep * lVar10 * c->elemsize + (long)c->data);
      if ((int)uVar6 < 4) {
        uVar9 = 0;
      }
      else {
        iVar8 = 3;
        do {
          fVar3 = pfVar11[1];
          fVar4 = pfVar11[2];
          fVar5 = pfVar11[3];
          auVar1 = *pauVar12;
          in_XMM2 = rcpps(in_XMM2,auVar1);
          fVar14 = *pfVar11 * in_XMM2._0_4_;
          fVar15 = fVar3 * in_XMM2._4_4_;
          fVar16 = fVar4 * in_XMM2._8_4_;
          fVar17 = fVar5 * in_XMM2._12_4_;
          *pfVar7 = (*pfVar11 - auVar1._0_4_ * fVar14) * in_XMM2._0_4_ + fVar14;
          pfVar7[1] = (fVar3 - auVar1._4_4_ * fVar15) * in_XMM2._4_4_ + fVar15;
          pfVar7[2] = (fVar4 - auVar1._8_4_ * fVar16) * in_XMM2._8_4_ + fVar16;
          pfVar7[3] = (fVar5 - auVar1._12_4_ * fVar17) * in_XMM2._12_4_ + fVar17;
          pfVar11 = pfVar11 + 4;
          pauVar12 = pauVar12 + 1;
          pfVar7 = pfVar7 + 4;
          iVar8 = iVar8 + 4;
          uVar9 = uVar6 & 0xfffffffc;
        } while (iVar8 < (int)uVar6);
      }
      if (uVar6 - uVar9 != 0 && (int)uVar9 <= (int)uVar6) {
        lVar13 = 0;
        do {
          pfVar7[lVar13] = pfVar11[lVar13] / *(float *)(*pauVar12 + lVar13 * 4);
          lVar13 = lVar13 + 1;
        } while (uVar6 - uVar9 != (int)lVar13);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return iVar2;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}